

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

int32_t utext_replace_63(UText *ut,int64_t nativeStart,int64_t nativeLimit,UChar *replacementText,
                        int32_t replacementLength,UErrorCode *status)

{
  UBool UVar1;
  int32_t i;
  UErrorCode *status_local;
  int32_t replacementLength_local;
  UChar *replacementText_local;
  int64_t nativeLimit_local;
  int64_t nativeStart_local;
  UText *ut_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    if ((ut->providerProperties & 8U) == 0) {
      *status = U_NO_WRITE_PERMISSION;
      ut_local._4_4_ = 0;
    }
    else {
      ut_local._4_4_ =
           (*ut->pFuncs->replace)
                     (ut,nativeStart,nativeLimit,replacementText,replacementLength,status);
    }
  }
  else {
    ut_local._4_4_ = 0;
  }
  return ut_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utext_replace(UText *ut,
             int64_t nativeStart, int64_t nativeLimit,
             const UChar *replacementText, int32_t replacementLength,
             UErrorCode *status)
{
    if (U_FAILURE(*status)) {
        return 0;
    }
    if ((ut->providerProperties & I32_FLAG(UTEXT_PROVIDER_WRITABLE)) == 0) {
        *status = U_NO_WRITE_PERMISSION;
        return 0;
    }
    int32_t i = ut->pFuncs->replace(ut, nativeStart, nativeLimit, replacementText, replacementLength, status);
    return i;
}